

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

void __thiscall
boost::runtime::parameter<std::__cxx11::string,(boost::runtime::args_amount)2,false>::
parameter<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::value_hint_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>
          (parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(boost::runtime::args_amount)2,_false>
           *this,cstring *name,
          named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::value_hint_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
          *m)

{
  bool bVar1;
  named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_RDX;
  named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::value_hint_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
  *in_RSI;
  cstring *in_RDI;
  basic_cstring<const_char> *this_00;
  invalid_param_spec *in_stack_fffffffffffffde0;
  specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>
  *in_stack_fffffffffffffde8;
  basic_cstring<const_char> *in_stack_fffffffffffffe20;
  specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>
  *in_stack_fffffffffffffe28;
  named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::value_hint_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
  *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  cstring *in_stack_ffffffffffffff98;
  basic_param *in_stack_ffffffffffffffa0;
  basic_cstring<const_char> local_28;
  named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
  *local_18;
  
  this_00 = &local_28;
  local_18 = in_RDX;
  unit_test::basic_cstring<const_char>::basic_cstring(this_00,(basic_cstring<const_char> *)in_RSI);
  basic_param::
  basic_param<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::value_hint_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(bool)in_stack_ffffffffffffff97,
             (bool)in_stack_ffffffffffffff96,in_stack_ffffffffffffff88);
  in_RDI->m_begin = (iterator)&PTR__parameter_003036d0;
  argument_factory<std::__cxx11::string,false,true>::
  argument_factory<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::value_hint_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>
            ((argument_factory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
              *)this_00,in_RSI);
  bVar1 = nfp::
          named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::has<boost::runtime::(anonymous_namespace)::default_value_t>(local_18);
  if (bVar1) {
    unit_test::basic_cstring<const_char>::basic_cstring(this_00);
    invalid_param_spec::invalid_param_spec(in_stack_fffffffffffffde0,in_RDI);
    specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>::operator<<
              (in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
    specific_param_error<boost::runtime::invalid_param_spec,boost::runtime::init_error>::operator<<
              (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>::operator<<
              (in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
    unit_test::ut_detail::throw_exception<boost::runtime::invalid_param_spec>
              (in_stack_fffffffffffffde0);
  }
  bVar1 = nfp::
          named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::has<boost::runtime::(anonymous_namespace)::optional_value_t>(local_18);
  if ((bVar1) && (((ulong)in_RDI[10].m_end & 0x100) != 0)) {
    unit_test::basic_cstring<const_char>::basic_cstring(this_00);
    invalid_param_spec::invalid_param_spec(in_stack_fffffffffffffde0,in_RDI);
    specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>::operator<<
              (in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
    specific_param_error<boost::runtime::invalid_param_spec,boost::runtime::init_error>::operator<<
              (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>::operator<<
              (in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
    unit_test::ut_detail::throw_exception<boost::runtime::invalid_param_spec>
              (in_stack_fffffffffffffde0);
  }
  return;
}

Assistant:

parameter( cstring name, Modifiers const& m )
#endif
    : basic_param( name, a != runtime::REQUIRED_PARAM, a == runtime::REPEATABLE_PARAM, m )
    , m_arg_factory( m )
    {
        BOOST_TEST_I_ASSRT( !m.has( default_value ) || a == runtime::OPTIONAL_PARAM,
                            invalid_param_spec() << "Parameter " << name
                                                 << " is not optional and can't have default_value." );

        BOOST_TEST_I_ASSRT( !m.has( optional_value ) || !this->p_repeatable,
                            invalid_param_spec() << "Parameter " << name
                                                 << " is repeatable and can't have optional_value." );
    }